

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int test_layer<ncnn::Slice>
              (int typeindex,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights,
              Option *_opt,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *a,int top_blob_count,
              vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_shapes,float epsilon,
              _func_void_Slice_ptr *func)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  Layer *this;
  size_type sVar4;
  const_reference __fn;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar5;
  reference __fn_00;
  size_type sVar6;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  ParamDict *in_RDX;
  undefined8 in_RSI;
  Option *in_R8;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *unaff_retaddr;
  _func_void_Slice_ptr *in_stack_00000008;
  code *in_stack_00000010;
  Mat c_fp32;
  size_t i_4;
  Option *in_stack_000000f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_000000f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000100;
  Slice *in_stack_00000108;
  size_t i_3;
  Mat a_bf16;
  size_t i_2;
  size_t i_1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> a4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> c;
  size_t i;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> b;
  ModelBinFromMatArray mb;
  Option opt;
  Layer *op;
  Option *in_stack_00000678;
  undefined4 in_stack_00000680;
  int in_stack_00000684;
  Mat *in_stack_00000688;
  Mat *in_stack_00000690;
  Mat *in_stack_fffffffffffffd58;
  Mat *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  uint in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  size_type in_stack_fffffffffffffd78;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffd80;
  ulong in_stack_fffffffffffffd88;
  float epsilon_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffd90;
  const_reference in_stack_fffffffffffffd98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffdf8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffe00;
  size_type local_1c8;
  Mat local_1c0;
  ulong local_180;
  Mat local_178;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_138;
  ulong local_130;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_100;
  Mat local_e8;
  ulong local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_98;
  undefined1 local_70 [16];
  Option local_60;
  Option *_opt_00;
  int typeindex_00;
  uint local_4;
  
  _opt_00 = in_R8;
  this = ncnn::create_layer(in_stack_fffffffffffffd6c);
  if (in_stack_00000010 != (code *)0x0) {
    (*in_stack_00000010)(this);
  }
  memcpy(&local_60,in_RCX,0x28);
  if ((this->support_vulkan & 1U) == 0) {
    local_60.use_vulkan_compute = false;
  }
  if ((this->support_packing & 1U) == 0) {
    local_60.use_packing_layout = false;
  }
  if ((this->support_bf16_storage & 1U) == 0) {
    local_60.use_bf16_storage = false;
  }
  if ((local_60.use_int8_inference & 1U) != 0) {
    local_60.use_bf16_storage = false;
  }
  if ((local_60.use_int8_inference & 1U) != 0) {
    local_60.use_packing_layout = false;
  }
  bVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                     CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  if (!bVar2) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  (*this->_vptr_Layer[2])(this,in_RSI);
  if (((this->one_blob_only & 1U) == 0) ||
     (sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)_opt_00), sVar4 == 1)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::data
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x119f29);
    ncnn::ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    (*this->_vptr_Layer[3])(this,local_70);
    (*this->_vptr_Layer[4])(this,&local_60);
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x119f99);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x119fc2);
    if ((this->support_inplace & 1U) == 0) {
      ncnn::Slice::forward(in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
    }
    else {
      for (local_a8 = 0; uVar1 = local_a8,
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)_opt_00),
          uVar1 < sVar4; local_a8 = local_a8 + 1) {
        __fn = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)_opt_00,local_a8);
        ncnn::Mat::clone(&local_e8,(__fn *)__fn,(void *)0x0,(int)sVar4,in_R8);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_98,local_a8);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd60);
        ncnn::Mat::~Mat((Mat *)0x11a06a);
      }
      ncnn::Layer::forward_inplace(this,&local_98,&local_60);
    }
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x11a16a);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x11a190);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)_opt_00);
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x11a1b4);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x11a1da);
    if ((local_60.use_packing_layout & 1U) == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    else {
      for (local_130 = 0; uVar1 = local_130,
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)_opt_00),
          uVar1 < sVar4; local_130 = local_130 + 1) {
        in_stack_fffffffffffffd98 =
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)_opt_00,local_130);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_120,local_130);
        ncnn::convert_packing
                  (in_stack_00000690,in_stack_00000688,in_stack_00000684,in_stack_00000678);
      }
    }
    if ((local_60.use_bf16_storage & 1U) != 0) {
      local_138 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
      while (in_stack_fffffffffffffd90 = local_138,
            pvVar5 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                     std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(&local_120),
            in_stack_fffffffffffffd90 < pvVar5) {
        ncnn::Mat::Mat(&local_178);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                  (&local_120,(size_type)local_138);
        ncnn::cast_float32_to_bfloat16
                  (in_stack_00000690,in_stack_00000688,
                   (Option *)CONCAT44(in_stack_00000684,in_stack_00000680));
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                  (&local_120,(size_type)local_138);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd60);
        ncnn::Mat::~Mat((Mat *)0x11a3bc);
        local_138 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                    ((long)&(local_138->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    if ((this->support_inplace & 1U) == 0) {
      (*this->_vptr_Layer[6])(this,&local_120,&local_100,&local_60);
    }
    else {
      local_180 = 0;
      while (in_stack_fffffffffffffd88 = local_180,
            sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(&local_120),
            in_stack_fffffffffffffd88 < sVar4) {
        __fn_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (&local_120,local_180);
        ncnn::Mat::clone(&local_1c0,(__fn *)__fn_00,(void *)0x0,(int)sVar4,in_R8);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_100,local_180);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd60);
        ncnn::Mat::~Mat((Mat *)0x11a4a5);
        local_180 = local_180 + 1;
      }
      (*this->_vptr_Layer[8])(this,&local_100,&local_60);
    }
    epsilon_00 = (float)(in_stack_fffffffffffffd88 >> 0x20);
    typeindex_00 = (int)in_RSI;
    if ((local_60.use_bf16_storage & 1U) != 0) {
      local_1c8 = 0;
      while( true ) {
        sVar4 = local_1c8;
        sVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(&local_100);
        epsilon_00 = (float)(in_stack_fffffffffffffd88 >> 0x20);
        typeindex_00 = (int)in_RSI;
        if (sVar6 <= sVar4) break;
        ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffdf8);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_100,local_1c8);
        ncnn::cast_bfloat16_to_float32
                  (in_stack_00000690,in_stack_00000688,
                   (Option *)CONCAT44(in_stack_00000684,in_stack_00000680));
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_100,local_1c8);
        ncnn::Mat::operator=
                  ((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd60);
        ncnn::Mat::~Mat((Mat *)0x11a5ed);
        local_1c8 = local_1c8 + 1;
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    (*this->_vptr_Layer[5])(this,&local_60);
    if (this != (Layer *)0x0) {
      (*this->_vptr_Layer[1])();
    }
    iVar3 = CompareMat((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffd98,
                       in_stack_fffffffffffffd90,epsilon_00);
    if (iVar3 == 0) {
      bVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::empty
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                         (ulong)in_stack_fffffffffffffd70);
      if (bVar2) {
        in_stack_fffffffffffffd70 =
             test_layer<ncnn::Slice>
                       (typeindex_00,in_RDX,in_RCX,_opt_00,
                        (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)CONCAT44(in_R9D,in_XMM0_Da)
                        ,(int)((ulong)this >> 0x20),unaff_retaddr,SUB84(this,0),in_stack_00000008);
        local_4 = in_stack_fffffffffffffd70;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      fprintf(_stderr,"test_layer failed cpu\n");
      local_4 = 0xffffffff;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(iVar3,in_stack_fffffffffffffd70));
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
               CONCAT44(iVar3,in_stack_fffffffffffffd70));
    ncnn::ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x11a7c4);
  }
  else {
    fprintf(_stderr,"layer with one_blob_only but consume multiple inputs\n");
    if (this != (Layer *)0x0) {
      (*this->_vptr_Layer[1])();
    }
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int test_layer(int typeindex, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const std::vector<ncnn::Mat>& a, int top_blob_count, const std::vector<ncnn::Mat>& top_shapes = std::vector<ncnn::Mat>(), float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Layer* op = ncnn::create_layer(typeindex);

    if (func)
    {
        (*func)((T*)op);
    }

    ncnn::Option opt = _opt;

    if (!op->support_vulkan) opt.use_vulkan_compute = false;
    if (!op->support_packing) opt.use_packing_layout = false;
    if (!op->support_bf16_storage) opt.use_bf16_storage = false;

    if (opt.use_int8_inference) opt.use_bf16_storage = false;
    if (opt.use_int8_inference) opt.use_packing_layout = false;

#if NCNN_VULKAN
    ncnn::VulkanDevice* vkdev = ncnn::get_gpu_device();

    ncnn::VkWeightBufferAllocator g_weight_vkallocator(vkdev);
    ncnn::VkWeightStagingBufferAllocator g_weight_staging_vkallocator(vkdev);

    ncnn::VkAllocator* blob_vkallocator = vkdev->acquire_blob_allocator();
    ncnn::VkAllocator* staging_vkallocator = vkdev->acquire_staging_allocator();

    opt.blob_vkallocator = blob_vkallocator;
    opt.workspace_vkallocator = blob_vkallocator;
    opt.staging_vkallocator = staging_vkallocator;

    if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
    if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;

    op->vkdev = vkdev;
#endif // NCNN_VULKAN

    if (!top_shapes.empty())
    {
        op->bottom_shapes = a;
        op->top_shapes = top_shapes;
    }

    op->load_param(pd);

    if (op->one_blob_only && a.size() != 1)
    {
        fprintf(stderr, "layer with one_blob_only but consume multiple inputs\n");
        delete op;
        return -1;
    }

    ncnn::ModelBinFromMatArray mb(weights.data());

    op->load_model(mb);

    op->create_pipeline(opt);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        ncnn::VkTransfer cmd(vkdev);

        ncnn::Option opt_upload = opt;
        opt_upload.blob_vkallocator = &g_weight_vkallocator;
        opt_upload.workspace_vkallocator = &g_weight_vkallocator;
        opt_upload.staging_vkallocator = &g_weight_staging_vkallocator;

        op->upload_model(cmd, opt_upload);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    std::vector<ncnn::Mat> b(top_blob_count);
    if (op->support_inplace)
    {
        for (size_t i=0; i<a.size(); i++)
        {
            b[i] = a[i].clone();
        }

        ((T*)op)->T::forward_inplace(b, opt);
    }
    else
    {
        ((T*)op)->T::forward(a, b, opt);
    }

    std::vector<ncnn::Mat> c(top_blob_count);
    {
        std::vector<ncnn::Mat> a4(a.size());
        if (opt.use_packing_layout)
        {
            for (size_t i=0; i<a.size(); i++)
            {
                ncnn::convert_packing(a[i], a4[i], 4, opt);
            }
        }
        else
        {
            a4 = a;
        }

        if (opt.use_bf16_storage)
        {
            for (size_t i=0; i<a4.size(); i++)
            {
                ncnn::Mat a_bf16;
                ncnn::cast_float32_to_bfloat16(a4[i], a_bf16, opt);
                a4[i] = a_bf16;
            }
        }

        if (op->support_inplace)
        {
            for (size_t i=0; i<a4.size(); i++)
            {
                c[i] = a4[i].clone();
            }

            op->forward_inplace(c, opt);
        }
        else
        {
            op->forward(a4, c, opt);
        }

        if (opt.use_bf16_storage)
        {
            for (size_t i=0; i<c.size(); i++)
            {
                ncnn::Mat c_fp32;
                ncnn::cast_bfloat16_to_float32(c[i], c_fp32, opt);
                c[i] = c_fp32;
            }
        }
    }

#if NCNN_VULKAN
    std::vector<ncnn::Mat> d(top_blob_count);
    if (opt.use_vulkan_compute)
    {
        // pack
        std::vector<ncnn::Mat> a4(a.size());
        for (size_t i=0; i<a.size(); i++)
        {
            if (opt.use_shader_pack8)
            {
                ncnn::convert_packing(a[i], a4[i], 8, opt);
                if (a4[i].elempack == 1)
                    ncnn::convert_packing(a[i], a4[i], 4, opt);
            }
            else
                ncnn::convert_packing(a[i], a4[i], 4, opt);
        }

        // fp16
        std::vector<ncnn::Mat> a4_fp16(a4.size());
        for (size_t i=0; i<a4.size(); i++)
        {
            if (opt.use_fp16_storage || ((a4[i].elempack == 4 || a4[i].elempack == 8) && opt.use_fp16_packed))
            {
                ncnn::cast_float32_to_float16(a4[i], a4_fp16[i], opt);
            }
            else
            {
                a4_fp16[i] = a4[i];
            }
        }

        // forward
        ncnn::VkCompute cmd(vkdev);

        // upload
        std::vector<ncnn::VkMat> a4_fp16_gpu(a4_fp16.size());
        for (size_t i=0; i<a4_fp16_gpu.size(); i++)
        {
            cmd.record_upload(a4_fp16[i], a4_fp16_gpu[i], opt);
        }

        std::vector<ncnn::VkMat> d4_fp16_gpu(top_blob_count);
        if (op->support_inplace)
        {
            op->forward_inplace(a4_fp16_gpu, cmd, opt);

            d4_fp16_gpu = a4_fp16_gpu;
        }
        else
        {
            op->forward(a4_fp16_gpu, d4_fp16_gpu, cmd, opt);
        }

        // download
        for (size_t i=0; i<d4_fp16_gpu.size(); i++)
        {
            cmd.record_download(d4_fp16_gpu[i], d[i], opt);
        }

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    op->destroy_pipeline(opt);

    delete op;

#if NCNN_VULKAN
    vkdev->reclaim_blob_allocator(blob_vkallocator);
    vkdev->reclaim_staging_allocator(staging_vkallocator);
    g_weight_vkallocator.clear();
    g_weight_staging_vkallocator.clear();
#endif // NCNN_VULKAN

    if (CompareMat(b, c, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed cpu\n");
        return -1;
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute && CompareMat(b, d, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed gpu\n");
        return -1;
    }
#endif // NCNN_VULKAN

    if (top_shapes.empty())
        return test_layer<T>(typeindex, pd, weights, opt, a, top_blob_count, b, epsilon, func);

    return 0;
}